

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

void __thiscall ON_wString::Destroy(ON_wString *this)

{
  ON_Internal_Empty_wString *hdr;
  
  hdr = (ON_Internal_Empty_wString *)(this->m_s + -3);
  if ((hdr != &empty_wstring && this->m_s != (wchar_t *)0x0) &&
     (0 < (hdr->header).ref_count.super___atomic_base<int>._M_i)) {
    ON_wStringHeader_DecrementRefCountAndDeleteIfZero((ON_wStringHeader *)hdr);
  }
  this->m_s = (wchar_t *)0x84a45c;
  return;
}

Assistant:

void ON_wString::Destroy()
{
  ON_wStringHeader* hdr = Header();
  if ( hdr != pEmptyStringHeader && nullptr != hdr && (int)(hdr->ref_count) > 0 )
    ON_wStringHeader_DecrementRefCountAndDeleteIfZero(hdr);
	Create();
}